

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MidiFile.cpp
# Opt level: O1

ulong smf::MidiFile::readLittleEndian4Bytes(istream *input)

{
  ulong uVar1;
  uchar buffer [4];
  uint local_c;
  
  local_c = 0;
  std::istream::read((char *)input,(long)&local_c);
  if (((byte)input[*(long *)(*(long *)input + -0x18) + 0x20] & 2) == 0) {
    uVar1 = (ulong)(int)(local_c >> 0x18 | (local_c & 0xff0000) >> 8 | (local_c & 0xff00) << 8 |
                        local_c << 0x18);
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Error: unexpected end of file.",0x1e);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '@');
    std::ostream::put('@');
    std::ostream::flush();
    uVar1 = 0;
  }
  return uVar1;
}

Assistant:

ulong MidiFile::readLittleEndian4Bytes(std::istream& input) {
	uchar buffer[4] = {0};
	input.read((char*)buffer, 4);
	if (input.eof()) {
		std::cerr << "Error: unexpected end of file." << std::endl;
		return 0;
	}
	return buffer[3] | (buffer[2] << 8) | (buffer[1] << 16) | (buffer[0] << 24);
}